

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void API::createIndex(IndexInfo *indexInfo)

{
  value_type pTVar1;
  bool bVar2;
  int iVar3;
  reference ppTVar4;
  pointer ppVar5;
  reference pvVar6;
  RecordSet *pRVar7;
  ostream *poVar8;
  void *this;
  value local_270;
  Addr local_240;
  IndexInfo local_238;
  int local_1d0;
  float fStack_1cc;
  IndexInfo local_1c8;
  int local_15c;
  string local_158 [4];
  int result;
  RecordSet *local_138;
  RecordSet *R;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [8];
  string filename;
  undefined1 local_f0 [8];
  value v;
  Addr p;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_50;
  iterator it;
  string local_38 [36];
  int local_14;
  IndexInfo *pIStack_10;
  int pos;
  IndexInfo *indexInfo_local;
  
  pIStack_10 = indexInfo;
  std::operator<<((ostream *)&std::cout,"create index ------------------\n");
  bVar2 = catalog::createIndex(&CM,pIStack_10);
  if (bVar2) {
    std::__cxx11::string::string(local_38,(string *)&pIStack_10->tableName);
    iVar3 = catalog::existTable(&CM,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    local_14 = iVar3;
    ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&CM.TableInfoList,(long)iVar3);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&(*ppTVar4)->getID,&pIStack_10->colunmName);
    ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&CM.TableInfoList,(long)local_14);
    pTVar1 = *ppTVar4;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_50);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pTVar1->type,(long)ppVar5->second);
    pIStack_10->type = *pvVar6;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_50);
    pIStack_10->indexID = ppVar5->second;
    IndexInfo::IndexInfo((IndexInfo *)&p,pIStack_10);
    IndexManager::CreateIndexFile(&IM,(IndexInfo *)&p);
    IndexInfo::~IndexInfo((IndexInfo *)&p);
    v.intV = 1;
    v.floatV = 0.0;
    value::value((value *)local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&R,
                   &RM.Direction);
    std::operator+(local_110,(char *)&R);
    std::__cxx11::string::~string((string *)&R);
    std::__cxx11::string::string(local_158,(string *)local_110);
    pRVar7 = RecordManager::FindRecordSet(&RM,(string *)local_158);
    std::__cxx11::string::~string(local_158);
    local_138 = pRVar7;
    while( true ) {
      do {
        IndexInfo::IndexInfo(&local_1c8,pIStack_10);
        local_1d0 = v.intV;
        fStack_1cc = v.floatV;
        iVar3 = RecordManager::ReturnKP(&RM,&local_1c8,(Addr)v._40_8_,(value *)local_f0);
        IndexInfo::~IndexInfo(&local_1c8);
        local_15c = iVar3;
      } while (iVar3 == 0);
      if (iVar3 == -1) break;
      IndexInfo::IndexInfo(&local_238,pIStack_10);
      local_240.BlockNum = v.intV;
      local_240.FileOff = (int)v.floatV;
      value::value(&local_270,(value *)local_f0);
      IndexManager::InsertSuchKey(&IM,&local_238,local_240,&local_270);
      value::~value(&local_270);
      IndexInfo::~IndexInfo(&local_238);
      RecordSet::Addp(local_138,(Addr *)&v.intV);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,v.intV);
      poVar8 = std::operator<<(poVar8,"\t");
      this = (void *)std::ostream::operator<<(poVar8,(int)v.floatV);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_110);
    value::~value((value *)local_f0);
  }
  return;
}

Assistant:

void API::createIndex(IndexInfo *indexInfo){
    std::cout <<"create index ------------------\n";
    if(!CM.createIndex(indexInfo))return;//建立catalog索引
    int pos = CM.existTable(indexInfo->tableName);
    
    auto it = CM.TableInfoList[pos]->getID.find(indexInfo->colunmName);
    indexInfo->type = CM.TableInfoList[pos]->type[it->second];
    indexInfo->indexID = it->second;
    IM.CreateIndexFile(*indexInfo);//建立indexfile

    //将之前插入table的值插入indexfile
    Addr p = {1,0};
    struct value v;
    string filename = RM.Direction + indexInfo->tableName + "_rcd.dat";
    RecordSet& R = RM.FindRecordSet(filename);
    while(1){
        int result = RM.ReturnKP(*indexInfo,p,v);
        if(result == 0)continue;
        else if(result == -1)break;
        IM.InsertSuchKey(*indexInfo,p,v);
        R.Addp(p);
        std::cout << p.BlockNum <<"\t"<<p.FileOff<<std::endl;
    }
}